

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O3

bool __thiscall
ruckig::TargetCalculator<3UL,_ruckig::StandardVector>::synchronize
          (TargetCalculator<3UL,_ruckig::StandardVector> *this,optional<double> t_min,double *t_sync
          ,optional<unsigned_long> *limiting_dof,Vector<Profile> *profiles,bool discrete_duration,
          double delta_time)

{
  long lVar1;
  double *pdVar2;
  double __numer;
  undefined1 auVar3 [16];
  ulong uVar4;
  double *pdVar5;
  char cVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  unsigned_long uVar11;
  StandardVectorIntervals<size_t> *__first;
  size_t sVar12;
  Block *__src;
  long lVar13;
  long lVar14;
  byte bVar15;
  StandardVector<Block,_3UL> *__last;
  _Storage<double,_true> _Var17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ldiv_t lVar23;
  _Storage<double,_true> local_48;
  byte bVar16;
  
  local_48 = t_min.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_payload;
  sVar12 = this->degrees_of_freedom;
  if (sVar12 == 0) {
    bVar15 = 0;
  }
  else {
    lVar7 = sVar12 * 0x10 + 0x30;
    lVar8 = sVar12 + 6;
    lVar13 = 0x57d;
    lVar14 = 0xc4;
    bVar15 = 0;
    do {
      if (*(int *)((long)(this->new_phase_control)._M_elems + lVar13 * 4) == 3) {
        *(undefined8 *)((long)this + lVar13 * 8 + -0x2bb8) = 0;
        (this->new_phase_control)._M_elems[lVar8] = INFINITY;
        *(undefined8 *)((long)(this->new_phase_control)._M_elems + lVar7) = 0x7ff0000000000000;
      }
      else {
        *(undefined8 *)((long)this + lVar13 * 8 + -0x2bb8) =
             *(undefined8 *)((long)(this->new_phase_control)._M_elems + lVar14 * 4);
        cVar6 = *(char *)((long)(this->blocks)._M_elems[0].p_min.brake.j._M_elems + lVar14 * 4 + 8);
        dVar18 = INFINITY;
        if (cVar6 == '\x01') {
          dVar18 = *(double *)((long)(this->pd)._M_elems + lVar14 * 4 + -8);
        }
        (this->new_phase_control)._M_elems[lVar8] = dVar18;
        bVar16 = *(byte *)((long)&(this->blocks)._M_elems[0].a.
                                  super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                  _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                  _M_payload + lVar14 * 4 + 0x198);
        uVar20 = 0x7ff0000000000000;
        if (bVar16 == 1) {
          uVar20 = *(undefined8 *)
                    ((long)(this->blocks)._M_elems[0].p_min.brake.a._M_elems + lVar14 * 4 + 8);
        }
        *(undefined8 *)((long)(this->new_phase_control)._M_elems + lVar7) = uVar20;
        if (cVar6 != '\0') {
          bVar16 = 1;
        }
        bVar15 = bVar16 | bVar15;
      }
      lVar7 = lVar7 + 8;
      lVar8 = lVar8 + 1;
      lVar1 = lVar13 - sVar12;
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x1be;
    } while (lVar1 != 0x57c);
  }
  _Var17 = local_48;
  if (((undefined1  [16])
       t_min.super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    _Var17._M_value = INFINITY;
  }
  ((_Storage<double,_true> *)((this->possible_t_syncs)._M_elems + sVar12 * 3))->_M_value =
       (double)_Var17;
  if (discrete_duration) {
    lVar8 = 0x30;
    do {
      dVar18 = *(double *)((long)(this->new_phase_control)._M_elems + lVar8);
      if ((ABS(dVar18) != INFINITY) &&
         (dVar18 = fmod(dVar18,delta_time), 2.220446049250313e-16 < dVar18)) {
        *(double *)((long)(this->new_phase_control)._M_elems + lVar8) =
             (delta_time - dVar18) + *(double *)((long)(this->new_phase_control)._M_elems + lVar8);
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x80);
  }
  auVar3 = _DAT_001170e0;
  if (((bVar15 | t_min.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_engaged) & 1) == 0) {
    __last = (StandardVector<Block,_3UL> *)((this->idx)._M_elems + this->degrees_of_freedom);
    if (this->degrees_of_freedom == 0) {
      sVar12 = 0;
      goto LAB_00113dd4;
    }
  }
  else {
    __last = &this->blocks;
  }
  __first = &this->idx;
  uVar4 = ((long)__last - (long)__first) - 8;
  auVar22._8_4_ = (int)uVar4;
  auVar22._0_8_ = uVar4;
  auVar22._12_4_ = (int)(uVar4 >> 0x20);
  auVar19._0_8_ = uVar4 >> 3;
  auVar19._8_8_ = auVar22._8_8_ >> 3;
  uVar9 = 0;
  auVar19 = auVar19 ^ _DAT_001170e0;
  auVar21 = _DAT_001170d0;
  do {
    auVar22 = auVar21 ^ auVar3;
    if ((bool)(~(auVar22._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar22._0_4_ ||
                auVar19._4_4_ < auVar22._4_4_) & 1)) {
      (this->idx)._M_elems[uVar9] = uVar9;
    }
    if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
        auVar22._12_4_ <= auVar19._12_4_) {
      (this->idx)._M_elems[uVar9 + 1] = uVar9 + 1;
    }
    uVar9 = uVar9 + 2;
    lVar8 = auVar21._8_8_;
    auVar21._0_8_ = auVar21._0_8_ + 2;
    auVar21._8_8_ = lVar8 + 2;
  } while (((uVar4 >> 3) + 2 & 0xfffffffffffffffe) != uVar9);
  uVar4 = (long)__last - (long)__first >> 3;
  lVar8 = 0x3f;
  if (uVar4 != 0) {
    for (; uVar4 >> lVar8 == 0; lVar8 = lVar8 + -1) {
    }
  }
  std::
  __introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::synchronize(std::optional<double>,double&,std::optional<unsigned_long>&,std::array<ruckig::Profile,3ul>&,bool,double)::_lambda(unsigned_long,unsigned_long)_1_>>
            (__first->_M_elems,(unsigned_long *)__last,(ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pantor[P]ruckig_include_ruckig_calculator_target_hpp:161:41)>
              )this);
  std::
  __final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::synchronize(std::optional<double>,double&,std::optional<unsigned_long>&,std::array<ruckig::Profile,3ul>&,bool,double)::_lambda(unsigned_long,unsigned_long)_1_>>
            (__first->_M_elems,(unsigned_long *)__last,
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pantor[P]ruckig_include_ruckig_calculator_target_hpp:161:41)>
              )this);
  sVar12 = this->degrees_of_freedom;
LAB_00113dd4:
  pdVar5 = (this->possible_t_syncs)._M_elems + sVar12 + 9;
  if ((StandardVector<Block,_3UL> *)pdVar5 != __last) {
    if (((undefined1  [16])
         t_min.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_48._M_value = 0.0;
    }
    do {
      __numer = *pdVar5;
      dVar18 = (this->possible_t_syncs)._M_elems[(long)__numer];
      if (sVar12 != 0) {
        lVar8 = 0xc4;
        sVar10 = 0;
        do {
          if (((this->inp_per_dof_synchronization)._M_elems[sVar10] != None) &&
             (((dVar18 < *(double *)((long)(this->new_phase_control)._M_elems + lVar8 * 4) ||
               (((*(char *)((long)(this->blocks)._M_elems[0].p_min.brake.j._M_elems + lVar8 * 4 + 8)
                  == '\x01' &&
                 (pdVar2 = (double *)((long)(this->new_phase_control)._M_elems + lVar8 * 4 + 8),
                 *pdVar2 <= dVar18 && dVar18 != *pdVar2)) &&
                (dVar18 < *(double *)((long)(this->pd)._M_elems + lVar8 * 4 + -8))))) ||
              (((*(char *)((long)&(this->blocks)._M_elems[0].a.
                                  super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                  _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                  _M_payload + lVar8 * 4 + 0x198) == '\x01' &&
                (pdVar2 = (double *)
                          ((long)(this->blocks)._M_elems[0].p_min.brake.a._M_elems + lVar8 * 4),
                *pdVar2 <= dVar18 && dVar18 != *pdVar2)) &&
               (dVar18 < *(double *)
                          ((long)(this->blocks)._M_elems[0].p_min.brake.a._M_elems + lVar8 * 4 + 8))
               ))))) goto LAB_00113ea2;
          sVar10 = sVar10 + 1;
          lVar8 = lVar8 + 0x1be;
        } while (sVar12 != sVar10);
      }
      if (ABS(dVar18) != INFINITY && local_48._M_value <= dVar18) {
        *t_sync = dVar18;
        if (__numer == (double)(sVar12 * 3)) {
          if ((limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged != true) {
            return true;
          }
          (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged = false;
          return true;
        }
        lVar23 = ldiv((long)__numer,sVar12);
        uVar11 = lVar23.rem;
        lVar8 = lVar23.quot;
        cVar6 = (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged;
        if ((bool)cVar6 == false) {
          (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged = true;
          cVar6 = '\x01';
        }
        (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar11;
        if (lVar8 == 2) {
          if (cVar6 == '\0') goto LAB_00113f83;
          __src = (Block *)((long)&(this->blocks)._M_elems[uVar11].b.
                                   super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                   _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                   _M_payload + 0x10);
        }
        else if (lVar8 == 1) {
          if (cVar6 == '\0') goto LAB_00113f83;
          __src = (Block *)((long)&(this->blocks)._M_elems[uVar11].a.
                                   super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                   _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                   _M_payload + 0x10);
        }
        else {
          if (lVar8 != 0) {
            return true;
          }
          if (cVar6 == '\0') {
LAB_00113f83:
            std::__throw_bad_optional_access();
          }
          __src = (this->blocks)._M_elems + uVar11;
        }
        memcpy(profiles->_M_elems + uVar11,__src,0x23c);
        return true;
      }
LAB_00113ea2:
      pdVar5 = pdVar5 + 1;
    } while ((StandardVector<Block,_3UL> *)pdVar5 != __last);
  }
  return false;
}

Assistant:

bool synchronize(std::optional<double> t_min, double& t_sync, std::optional<size_t>& limiting_dof, Vector<Profile>& profiles, bool discrete_duration, double delta_time) {
        // Check for (degrees_of_freedom == 1 && !t_min && !discrete_duration) is now outside

        // Possible t_syncs are the start times of the intervals and optional t_min
        bool any_interval {false};
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            // Ignore DoFs without synchronization here
            if (inp_per_dof_synchronization[dof] == Synchronization::None) {
                possible_t_syncs[dof] = 0.0;
                possible_t_syncs[degrees_of_freedom + dof] = std::numeric_limits<double>::infinity();
                possible_t_syncs[2 * degrees_of_freedom + dof] = std::numeric_limits<double>::infinity();
                continue;
            }

            possible_t_syncs[dof] = blocks[dof].t_min;
            possible_t_syncs[degrees_of_freedom + dof] = blocks[dof].a ? blocks[dof].a->right : std::numeric_limits<double>::infinity();
            possible_t_syncs[2 * degrees_of_freedom + dof] = blocks[dof].b ? blocks[dof].b->right : std::numeric_limits<double>::infinity();
            any_interval |= blocks[dof].a || blocks[dof].b;
        }
        possible_t_syncs[3 * degrees_of_freedom] = t_min.value_or(std::numeric_limits<double>::infinity());
        any_interval |= t_min.has_value();

        if (discrete_duration) {
            for (auto& possible_t_sync: possible_t_syncs) {
                if (std::isinf(possible_t_sync)) {
                    continue;
                }

                const double remainder = std::fmod(possible_t_sync, delta_time); // in [0, delta_time)
                if (remainder > eps) {
                    possible_t_sync += delta_time - remainder;
                }
            }
        }

        // Test them in sorted order
        auto idx_end = any_interval ? idx.end() : idx.begin() + degrees_of_freedom;
        std::iota(idx.begin(), idx_end, 0);
        std::sort(idx.begin(), idx_end, [&](size_t i, size_t j) { return possible_t_syncs[i] < possible_t_syncs[j]; });

        // Start at last tmin (or worse)
        for (auto i = idx.begin() + degrees_of_freedom - 1; i != idx_end; ++i) {
            const double possible_t_sync = possible_t_syncs[*i];
            bool is_blocked {false};
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp_per_dof_synchronization[dof] == Synchronization::None) {
                    continue; // inner dof loop
                }
                if (blocks[dof].is_blocked(possible_t_sync)) {
                    is_blocked = true;
                    break; // inner dof loop
                }
            }
            if (is_blocked || possible_t_sync < t_min.value_or(0.0) || std::isinf(possible_t_sync)) {
                continue;
            }

            t_sync = possible_t_sync;
            if (*i == 3*degrees_of_freedom) { // Optional t_min
                limiting_dof = std::nullopt;
                return true;
            }

            const auto div = std::div(static_cast<long>(*i), static_cast<long>(degrees_of_freedom));
            limiting_dof = div.rem;
            switch (div.quot) {
                case 0: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].p_min;
                } break;
                case 1: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].a->profile;
                } break;
                case 2: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].b->profile;
                } break;
            }
            return true;
        }

        return false;
    }